

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O3

void __thiscall Node::SmoothTypes(Node *this,Node *DefaultType)

{
  pointer pcVar1;
  Node **ppNVar2;
  VARTYPE VVar3;
  int iVar4;
  Node *pNVar5;
  Node *this_00;
  _Alloc_hider _Var6;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  while (ppNVar2 = this->Tree, ppNVar2[1] != (Node *)0x0) {
    this = this->Block[0];
    DefaultType = ppNVar2[1];
    if (this == (Node *)0x0) {
      return;
    }
  }
  pNVar5 = this->Tree[0];
  if (DefaultType == (Node *)0x0) {
    this_00 = (Node *)operator_new(0x70);
    if (pNVar5 == (Node *)0x0) {
      iVar4 = UnguessVarType(VARTYPE_NONE);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
      Node(this_00,iVar4,&local_d0,0,0);
      this->Tree[1] = this_00;
      _Var6._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0010aca3;
    }
    else {
      pcVar1 = (pNVar5->TextValue)._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + (pNVar5->TextValue)._M_string_length);
      VVar3 = GuessVarType(&local_90);
      iVar4 = UnguessVarType(VVar3);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
      Node(this_00,iVar4,&local_b0,0,0);
      this->Tree[1] = this_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_d0.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
      _Var6._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_0010aca3;
    }
  }
  else {
    pcVar1 = (pNVar5->TextValue)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (pNVar5->TextValue)._M_string_length);
    VVar3 = GuessVarType(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pNVar5 = (Node *)operator_new(0x70);
    if (VVar3 == VARTYPE_REAL) {
      Node(pNVar5,DefaultType);
      this->Tree[1] = pNVar5;
      goto LAB_0010aca3;
    }
    iVar4 = UnguessVarType(VVar3);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    Node(pNVar5,iVar4,&local_70,0,0);
    this->Tree[1] = pNVar5;
    local_d0.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    _Var6._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0010aca3;
  }
  operator_delete(_Var6._M_p,local_d0.field_2._M_allocated_capacity + 1);
LAB_0010aca3:
  if (this->Block[0] == (Node *)0x0) {
    return;
  }
  SmoothTypes(this->Block[0],DefaultType);
  return;
}

Assistant:

void Node::SmoothTypes(
	Node* DefaultType	/**< Node that defines the default types */
)
{
	bool actualtype = false;

	if (Tree[1] == 0)
	{
		//
		// Fake up a defintion for this segment since we dont have
		// on entered directly on this line.
		//
		if (DefaultType != 0)
		{
			VARTYPE rawtype = GuessVarType(Tree[0]->TextValue);
			if (rawtype == VARTYPE_REAL)
			{
				Tree[1] = new Node(*DefaultType);
			}
			else
			{
				Tree[1] = new Node(UnguessVarType(rawtype));
			}
		}
		else
		{
			if (Tree[0] != 0)
			{
				Tree[1] = new Node(UnguessVarType(
					GuessVarType(Tree[0]->TextValue)));
			}
			else
			{
				Tree[1] = new Node(UnguessVarType(VARTYPE_NONE));
			}
		}
	}
	else
	{
		//
		// We need to keep track of weither we have been given
		// an actual definition on this segment, or if we have
		// faked one up.
		//
		actualtype = true;
	}

	if (Block[0] != 0)
	{
		//
		// If we have an actual type here, use it, else use
		// what came from a previous segment
		//
		if (actualtype)
		{
			Block[0]->SmoothTypes(Tree[1]);
		}
		else
		{
			Block[0]->SmoothTypes(DefaultType);
		}
	}
}